

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode easy_perform(SessionHandle *data,_Bool events)

{
  CURLMcode CVar1;
  CURLcode local_34;
  CURLcode code;
  CURLMcode mcode;
  CURLM *multi;
  _Bool events_local;
  SessionHandle *data_local;
  
  if (data == (SessionHandle *)0x0) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if (data->multi == (Curl_multi *)0x0) {
    if (data->multi_easy == (Curl_multi *)0x0) {
      _code = Curl_multi_handle(1,3);
      if (_code == (Curl_multi *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      data->multi_easy = _code;
    }
    else {
      _code = data->multi_easy;
    }
    curl_multi_setopt(_code,CURLMOPT_MAXCONNECTS,(data->set).maxconnects);
    CVar1 = curl_multi_add_handle(_code,data);
    if (CVar1 == CURLM_OK) {
      data->multi = _code;
      if (events) {
        local_34 = CURLE_NOT_BUILT_IN;
      }
      else {
        local_34 = easy_transfer(_code);
      }
      curl_multi_remove_handle(_code,data);
      data_local._4_4_ = local_34;
    }
    else {
      curl_multi_cleanup(_code);
      if (CVar1 == CURLM_OUT_OF_MEMORY) {
        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        data_local._4_4_ = CURLE_FAILED_INIT;
      }
    }
  }
  else {
    Curl_failf(data,"easy handle already used in multi handle");
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode easy_perform(struct SessionHandle *data, bool events)
{
  CURLM *multi;
  CURLMcode mcode;
  CURLcode code = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    else
      return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* assign this after curl_multi_add_handle() since that function checks for
     it and rejects this handle otherwise */
  data->multi = multi;

  /* run the transfer */
  code = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return code;
}